

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

_Bool mi_os_protectx(void *addr,size_t size,_Bool protect)

{
  uint uVar1;
  void *start;
  _Bool _Var2;
  char *pcVar3;
  size_t csize;
  size_t local_20;
  
  local_20 = 0;
  start = mi_os_page_align_area_conservative(addr,size,&local_20);
  if (local_20 == 0) {
    _Var2 = false;
  }
  else {
    uVar1 = _mi_prim_protect(start,local_20,protect);
    if (uVar1 == 0) {
      _Var2 = true;
    }
    else {
      pcVar3 = "unprotect";
      if (protect) {
        pcVar3 = "protect";
      }
      _Var2 = false;
      _mi_warning_message("cannot %s OS memory (error: %d (0x%x), address: %p, size: 0x%zx bytes)\n"
                          ,pcVar3,(ulong)uVar1,(ulong)uVar1,start,local_20);
    }
  }
  return _Var2;
}

Assistant:

static  bool mi_os_protectx(void* addr, size_t size, bool protect) {
  // page align conservatively within the range
  size_t csize = 0;
  void* start = mi_os_page_align_area_conservative(addr, size, &csize);
  if (csize == 0) return false;
  /*
  if (_mi_os_is_huge_reserved(addr)) {
	  _mi_warning_message("cannot mprotect memory allocated in huge OS pages\n");
  }
  */
  int err = _mi_prim_protect(start,csize,protect);
  if (err != 0) {
    _mi_warning_message("cannot %s OS memory (error: %d (0x%x), address: %p, size: 0x%zx bytes)\n", (protect ? "protect" : "unprotect"), err, err, start, csize);
  }
  return (err == 0);
}